

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

Result __thiscall tonk::gateway::ParsedURL::Parse(ParsedURL *this,string *url)

{
  undefined8 uVar1;
  undefined2 uVar2;
  int iVar3;
  address_v4 aVar4;
  long lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  ushort uVar8;
  ulong in_RDX;
  long lVar9;
  Result *success;
  ParsedURL *pPVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar11;
  bad_address_cast ex;
  string ip;
  string path;
  error_code ec;
  address local_a8;
  ParsedURL *local_88;
  char *local_80 [2];
  char local_70 [16];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  error_code local_40;
  
  local_88 = this;
  std::__cxx11::string::_M_assign((string *)url);
  lVar5 = std::__cxx11::string::find((char)in_RDX,0x3a);
  lVar9 = -1;
  if (lVar5 + 1 != 0) {
    lVar9 = lVar5 + 1;
  }
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  lVar5 = std::__cxx11::string::find((char)in_RDX,0x2f);
  if (lVar5 == -1) {
    local_58 = 0;
    *local_60 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_80,in_RDX);
    std::__cxx11::string::operator=((string *)&local_60,(string *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
  }
  if (lVar9 == -1) {
    iVar3 = 0x50;
LAB_00139422:
    std::__cxx11::string::substr((ulong)local_80,in_RDX);
    std::__cxx11::string::_M_assign((string *)(url + 2));
    uVar2 = 0x50;
    if (iVar3 != 0x1bb) {
      uVar2 = (undefined2)iVar3;
    }
    *(undefined2 *)&url[3]._M_dataplus._M_p = uVar2;
    std::__cxx11::string::_M_assign((string *)(url + 1));
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)std::_V2::system_category();
    asio::ip::make_address(&local_a8,local_80[0],&local_40);
    *(anon_enum_32 *)&url[3]._M_string_length = local_a8.type_;
    ((in4_addr_type *)((long)&url[3]._M_string_length + 4))->s_addr =
         (in_addr_t)local_a8.ipv4_address_.addr_.s_addr;
    url[3].field_2._M_allocated_capacity = local_a8.ipv6_address_.addr_.__in6_u._0_8_;
    *(undefined8 *)((long)&url[3].field_2 + 8) = local_a8.ipv6_address_.addr_.__in6_u._8_8_;
    url[4]._M_dataplus._M_p = (pointer)local_a8.ipv6_address_.scope_id_;
    if (local_40._M_value == 0) {
      uVar8 = *(ushort *)&url[3]._M_dataplus._M_p;
      if (local_a8.type_ == ipv6) {
        uVar8 = uVar8 << 8 | uVar8 >> 8;
        aVar11 = url[3].field_2;
        aVar4.addr_.s_addr = (in4_addr_type)0;
        uVar2 = 10;
      }
      else {
        if (local_a8.type_ != ipv4) {
          local_a8._0_8_ = &PTR__bad_cast_001bbee8;
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = &PTR__bad_cast_001bbee8;
          __cxa_throw(puVar7,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        uVar8 = uVar8 << 8 | uVar8 >> 8;
        aVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )(ZEXT816(0) << 0x20);
        local_a8.ipv6_address_.scope_id_ = 0;
        uVar2 = 2;
        aVar4.addr_.s_addr = local_a8.ipv4_address_.addr_.s_addr;
      }
      *(undefined2 *)&url[4]._M_string_length = uVar2;
      *(ushort *)((long)&url[4]._M_string_length + 2) = uVar8;
      *(in4_addr_type *)((long)&url[4]._M_string_length + 4) = aVar4.addr_.s_addr;
      url[4].field_2 = aVar11;
      *(int *)&url[5]._M_dataplus._M_p = (int)local_a8.ipv6_address_.scope_id_;
      (local_88->FullURL)._M_dataplus._M_p = (char *)0x0;
      pPVar10 = local_88;
    }
    else {
      (**(code **)(*(long *)local_40._M_cat + 0x20))(&local_a8);
      lVar9 = (long)local_40._M_value;
      pcVar6 = (char *)operator_new(0x38);
      *(char **)pcVar6 = "retrieveDescription: Invalid IP string";
      *(char **)(pcVar6 + 8) = pcVar6 + 0x18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pcVar6 + 8),local_a8._0_8_,
                 local_a8._0_8_ + local_a8.ipv6_address_.addr_.__in6_u._0_8_);
      pPVar10 = local_88;
      pcVar6[0x28] = '\x02';
      pcVar6[0x29] = '\0';
      pcVar6[0x2a] = '\0';
      pcVar6[0x2b] = '\0';
      *(long *)(pcVar6 + 0x30) = lVar9;
      (local_88->FullURL)._M_dataplus._M_p = pcVar6;
      if (local_a8._0_8_ != (long)local_a8.ipv6_address_.addr_.__in6_u.__u6_addr8 + 8U) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    if (local_80[0] == local_70) goto LAB_00139647;
  }
  else {
    std::__cxx11::string::substr((ulong)local_80,in_RDX);
    pcVar6 = local_80[0];
    iVar3 = atoi(local_80[0]);
    if (0 < iVar3) {
      if (pcVar6 != local_70) {
        operator_delete(pcVar6);
      }
      goto LAB_00139422;
    }
    uVar1 = (long)local_a8.ipv6_address_.addr_.__in6_u.__u6_addr8 + 8;
    local_a8._0_8_ = uVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Port did not parse","");
    pcVar6 = (char *)operator_new(0x38);
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    *(char **)(pcVar6 + 8) = pcVar6 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar6 + 8),local_a8._0_8_,
               local_a8._0_8_ + local_a8.ipv6_address_.addr_.__in6_u._0_8_);
    pPVar10 = local_88;
    pcVar6[0x28] = '\0';
    pcVar6[0x29] = '\0';
    pcVar6[0x2a] = '\0';
    pcVar6[0x2b] = '\0';
    pcVar6[0x30] = '\x02';
    pcVar6[0x31] = '\0';
    pcVar6[0x32] = '\0';
    pcVar6[0x33] = '\0';
    pcVar6[0x34] = '\0';
    pcVar6[0x35] = '\0';
    pcVar6[0x36] = '\0';
    pcVar6[0x37] = '\0';
    (local_88->FullURL)._M_dataplus._M_p = pcVar6;
    if (local_a8._0_8_ != uVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
    if (local_80[0] == local_70) goto LAB_00139647;
  }
  operator_delete(local_80[0]);
LAB_00139647:
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return (Result)(ErrorResult *)pPVar10;
}

Assistant:

Result ParsedURL::Parse(const std::string& url)
{
    FullURL = url;

    size_t ipEnd, slash;

    // Find port offset
    size_t portStart = url.find(':');
    if (portStart == std::string::npos) {
        ipEnd = url.length();
        slash = std::string::npos;
    }
    else {
        ipEnd = portStart;
        ++portStart;
        slash = portStart;
    }

    size_t portEnd;
    std::string path;
    int port;

    // Find path offset relative to port
    slash = url.find('/', slash);
    if (slash == std::string::npos) {
        portEnd = url.length();
        path.clear();
    }
    else {
        portEnd = slash;
        if (ipEnd > slash) {
            ipEnd = slash;
        }
        path = url.substr(slash + 1);
    }

    // Parse out port field
    if (portStart == std::string::npos) {
        port = 80; // Default HTTP port
    }
    else {
        const std::string portStr = url.substr(portStart, portEnd - portStart);
        port = atoi(portStr.c_str());
        if (port <= 0) {
            return Result("Port did not parse");
        }
    }

    // Note that regardless of protocol we always connect on port 80 with
    // HTTP (no SSL encryption) unless a port is specified in the URL
    if (port == 443) {
        // Force port 80 instead of HTTPS since we do not support encryption
        port = 80;
    }

    // Parse out IP field
    std::string ip = url.substr(0, ipEnd);

    // Fill info
    IP = ip;
    Port = (uint16_t)port;
    XMLPath = path;

    asio::error_code ec;

    // Convert IP string to IP address
    IPAddr = asio::ip::make_address(ip, ec);

    if (ec) {
        return Result("retrieveDescription: Invalid IP string", ec.message(), ErrorType::Asio, ec.value());
    }

    TCPEndpoint = asio::ip::tcp::endpoint(IPAddr, Port);

    return Result::Success();
}